

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NewCNF.hpp
# Opt level: O1

void __thiscall Shell::NewCNF::~NewCNF(NewCNF *this)

{
  Formula **ppFVar1;
  ulong uVar2;
  
  ::Lib::
  DHMap<Lib::List<std::pair<unsigned_int,_Kernel::Term_*>_>_*,_Kernel::Substitution_*,_Lib::DefaultHash,_Lib::DefaultHash2>
  ::~DHMap(&this->_substitutionsByBindings);
  ::Lib::
  DHMap<const_Lib::SharedSet<unsigned_int>_*,_Lib::List<std::pair<unsigned_int,_Kernel::Term_*>_>_*,_Lib::DefaultHash,_Lib::DefaultHash2>
  ::~DHMap(&this->_foolSkolemsByFreeVars);
  ::Lib::
  DHMap<Lib::List<std::pair<unsigned_int,_Kernel::Term_*>_>_*,_Lib::List<std::pair<unsigned_int,_Kernel::Term_*>_>_*,_Lib::DefaultHash,_Lib::DefaultHash2>
  ::~DHMap(&this->_foolSkolemsByBindings);
  ::Lib::
  DHMap<const_Lib::SharedSet<unsigned_int>_*,_Lib::List<std::pair<unsigned_int,_Kernel::Term_*>_>_*,_Lib::DefaultHash,_Lib::DefaultHash2>
  ::~DHMap(&this->_skolemsByFreeVars);
  ::Lib::
  DHMap<Lib::List<std::pair<unsigned_int,_Kernel::Term_*>_>_*,_Lib::List<std::pair<unsigned_int,_Kernel::Term_*>_>_*,_Lib::DefaultHash,_Lib::DefaultHash2>
  ::~DHMap(&this->_skolemsByBindings);
  ::Lib::
  DHMap<Kernel::Formula_*,_const_Lib::SharedSet<unsigned_int>_*,_Lib::DefaultHash,_Lib::DefaultHash2>
  ::~DHMap(&this->_freeVars);
  ::Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>::~DHMap
            (&this->_varSorts);
  ::Lib::DHMap<Kernel::Formula_*,_Shell::NewCNF::Occurrences,_Lib::DefaultHash,_Lib::DefaultHash2>::
  ~DHMap(&this->_occurrences);
  std::__cxx11::
  _List_base<Lib::SmartPtr<Shell::NewCNF::GenClause>,_std::allocator<Lib::SmartPtr<Shell::NewCNF::GenClause>_>_>
  ::_M_clear(&(this->_genClauses).
              super__List_base<Lib::SmartPtr<Shell::NewCNF::GenClause>,_std::allocator<Lib::SmartPtr<Shell::NewCNF::GenClause>_>_>
            );
  ::Lib::DHMap<Kernel::Formula_*,_bool,_Lib::DefaultHash,_Lib::DefaultHash2>::~DHMap
            (&this->_formulasCache);
  ::Lib::DHMap<Kernel::Literal_*,_bool,_Lib::DefaultHash,_Lib::DefaultHash2>::~DHMap
            (&this->_literalsCache);
  BindingStore::~BindingStore(&this->_foolBindingStore);
  BindingStore::~BindingStore(&this->_bindingStore);
  ppFVar1 = (this->_queue)._data;
  if (ppFVar1 != (Formula **)0x0) {
    uVar2 = (this->_queue)._capacity * 8 + 0xf & 0xfffffffffffffff0;
    if (uVar2 == 0) {
      *ppFVar1 = (Formula *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = ppFVar1;
    }
    else if (uVar2 < 0x11) {
      *ppFVar1 = (Formula *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = ppFVar1;
    }
    else if (uVar2 < 0x19) {
      *ppFVar1 = (Formula *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = ppFVar1;
    }
    else if (uVar2 < 0x21) {
      *ppFVar1 = (Formula *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = ppFVar1;
    }
    else if (uVar2 < 0x31) {
      *ppFVar1 = (Formula *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = ppFVar1;
    }
    else {
      if (0x40 < uVar2) {
        operator_delete(ppFVar1,0x10);
        return;
      }
      *ppFVar1 = (Formula *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = ppFVar1;
    }
  }
  return;
}

Assistant:

NewCNF(unsigned namingThreshold)
    : _namingThreshold(namingThreshold), _iteInliningThreshold((unsigned)ceil(log2(namingThreshold))),
      _collectedVarSorts(false), _maxVar(0),_forInduction(false) {}